

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::BitSet::equals(BitSet *this,BitSet *other)

{
  ulong local_28;
  XMLSize_t i;
  BitSet *other_local;
  BitSet *this_local;
  
  if (this == other) {
    this_local._7_1_ = true;
  }
  else if (this->fUnitLen == other->fUnitLen) {
    for (local_28 = 0; local_28 < this->fUnitLen; local_28 = local_28 + 1) {
      if (this->fBits[local_28] != other->fBits[local_28]) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BitSet::equals(const BitSet& other) const
{
    if (this == &other)
        return true;

    if (fUnitLen != other.fUnitLen)
        return false;

    for (XMLSize_t i = 0; i < fUnitLen; i++)
    {
        if (fBits[i] != other.fBits[i])
            return false;
    }
    return true;
}